

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O1

void __thiscall trng::mrg5s::split(mrg5s *this,uint s,uint n)

{
  int iVar1;
  int iVar2;
  uint i_9;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint i;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  int32_t a [5];
  int32_t b [25];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_98,"invalid argument for trng::mrg5s::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_98);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_98);
  }
  if (1 < s) {
    uVar21 = (ulong)n + 1;
    if (n < 0xf) {
      iVar2 = (this->S).r[0];
      iVar11 = (this->S).r[1];
      iVar17 = (this->S).r[2];
      iVar18 = (this->S).r[4];
      iVar19 = (this->S).r[3];
      do {
        iVar20 = iVar19;
        iVar19 = iVar17;
        iVar17 = iVar11;
        iVar11 = iVar2;
        uVar14 = (long)iVar20 * (long)(this->P).a[3] + (long)iVar19 * (long)(this->P).a[2] +
                 (long)iVar17 * (long)(this->P).a[1] + (long)iVar11 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar18 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar18 = (int)uVar15;
        iVar2 = iVar18 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar2 = iVar18;
        }
        uVar16 = (int)uVar21 - 1;
        uVar21 = (ulong)uVar16;
        iVar18 = iVar20;
      } while (uVar16 != 0);
      (this->S).r[0] = iVar2;
      (this->S).r[1] = iVar11;
      (this->S).r[2] = iVar17;
      (this->S).r[3] = iVar19;
      (this->S).r[4] = iVar20;
    }
    else {
      uVar16 = 0;
      do {
        if ((uVar21 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar21;
        uVar21 = uVar21 >> 1;
      } while (bVar22);
    }
    uVar21 = (ulong)s;
    iVar2 = (this->S).r[0];
    if (s < 0x10) {
      iVar3 = s + (s == 0);
      iVar11 = (this->S).r[1];
      iVar17 = (this->S).r[2];
      iVar18 = (this->S).r[3];
      iVar19 = (this->S).r[4];
      iVar20 = iVar2;
      do {
        iVar4 = iVar20;
        iVar5 = iVar18;
        iVar18 = iVar17;
        iVar17 = iVar11;
        uVar14 = (long)iVar5 * (long)(this->P).a[3] + (long)iVar18 * (long)(this->P).a[2] +
                 (long)iVar17 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar19 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar11 = (int)uVar15;
        iVar20 = iVar11 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar20 = iVar11;
        }
        iVar3 = iVar3 + -1;
        iVar11 = iVar4;
        iVar19 = iVar5;
      } while (iVar3 != 0);
      (this->S).r[0] = iVar20;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar17;
      (this->S).r[3] = iVar18;
      (this->S).r[4] = iVar5;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar11 = (this->S).r[0];
    if (s < 0x10) {
      iVar4 = s + (s == 0);
      iVar17 = (this->S).r[1];
      iVar18 = (this->S).r[3];
      iVar19 = (this->S).r[4];
      iVar20 = iVar11;
      iVar3 = (this->S).r[2];
      do {
        iVar5 = iVar3;
        iVar6 = iVar20;
        iVar7 = iVar18;
        iVar3 = iVar17;
        uVar14 = (long)iVar7 * (long)(this->P).a[3] + (long)iVar5 * (long)(this->P).a[2] +
                 (long)iVar3 * (long)(this->P).a[1] + (long)iVar6 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar19 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar17 = (int)uVar15;
        iVar20 = iVar17 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar20 = iVar17;
        }
        iVar4 = iVar4 + -1;
        iVar17 = iVar6;
        iVar18 = iVar5;
        iVar19 = iVar7;
      } while (iVar4 != 0);
      (this->S).r[0] = iVar20;
      (this->S).r[1] = iVar6;
      (this->S).r[2] = iVar3;
      (this->S).r[3] = iVar5;
      (this->S).r[4] = iVar7;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar17 = (this->S).r[0];
    if (s < 0x10) {
      iVar5 = s + (s == 0);
      iVar18 = (this->S).r[1];
      iVar19 = (this->S).r[3];
      iVar20 = (this->S).r[4];
      iVar3 = iVar17;
      iVar4 = (this->S).r[2];
      do {
        iVar6 = iVar4;
        iVar7 = iVar3;
        iVar8 = iVar19;
        iVar4 = iVar18;
        uVar14 = (long)iVar8 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar4 * (long)(this->P).a[1] + (long)iVar7 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar20 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar18 = (int)uVar15;
        iVar3 = iVar18 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar3 = iVar18;
        }
        iVar5 = iVar5 + -1;
        iVar18 = iVar7;
        iVar19 = iVar6;
        iVar20 = iVar8;
      } while (iVar5 != 0);
      (this->S).r[0] = iVar3;
      (this->S).r[1] = iVar7;
      (this->S).r[2] = iVar4;
      (this->S).r[3] = iVar6;
      (this->S).r[4] = iVar8;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar18 = (this->S).r[0];
    if (s < 0x10) {
      iVar6 = s + (s == 0);
      iVar19 = (this->S).r[1];
      iVar20 = (this->S).r[3];
      iVar3 = (this->S).r[4];
      iVar4 = iVar18;
      iVar5 = (this->S).r[2];
      do {
        iVar7 = iVar5;
        iVar8 = iVar4;
        iVar9 = iVar20;
        iVar5 = iVar19;
        uVar14 = (long)iVar9 * (long)(this->P).a[3] + (long)iVar7 * (long)(this->P).a[2] +
                 (long)iVar5 * (long)(this->P).a[1] + (long)iVar8 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar3 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar19 = (int)uVar15;
        iVar4 = iVar19 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar4 = iVar19;
        }
        iVar6 = iVar6 + -1;
        iVar19 = iVar8;
        iVar20 = iVar7;
        iVar3 = iVar9;
      } while (iVar6 != 0);
      (this->S).r[0] = iVar4;
      (this->S).r[1] = iVar8;
      (this->S).r[2] = iVar5;
      (this->S).r[3] = iVar7;
      (this->S).r[4] = iVar9;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar19 = (this->S).r[0];
    if (s < 0x10) {
      iVar7 = s + (s == 0);
      iVar20 = (this->S).r[1];
      iVar3 = (this->S).r[3];
      iVar4 = (this->S).r[4];
      iVar5 = iVar19;
      iVar6 = (this->S).r[2];
      do {
        iVar8 = iVar6;
        iVar9 = iVar5;
        iVar10 = iVar3;
        iVar6 = iVar20;
        uVar14 = (long)iVar10 * (long)(this->P).a[3] + (long)iVar8 * (long)(this->P).a[2] +
                 (long)iVar6 * (long)(this->P).a[1] + (long)iVar9 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar4 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar20 = (int)uVar15;
        iVar5 = iVar20 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar5 = iVar20;
        }
        iVar7 = iVar7 + -1;
        iVar20 = iVar9;
        iVar3 = iVar8;
        iVar4 = iVar10;
      } while (iVar7 != 0);
      (this->S).r[0] = iVar5;
      (this->S).r[1] = iVar9;
      (this->S).r[2] = iVar6;
      (this->S).r[3] = iVar8;
      (this->S).r[4] = iVar10;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar20 = (this->S).r[0];
    if (s < 0x10) {
      iVar8 = s + (s == 0);
      iVar3 = (this->S).r[1];
      iVar4 = (this->S).r[3];
      iVar5 = (this->S).r[4];
      iVar6 = iVar20;
      iVar7 = (this->S).r[2];
      do {
        iVar9 = iVar7;
        iVar10 = iVar6;
        iVar1 = iVar4;
        iVar7 = iVar3;
        uVar14 = (long)iVar1 * (long)(this->P).a[3] + (long)iVar9 * (long)(this->P).a[2] +
                 (long)iVar7 * (long)(this->P).a[1] + (long)iVar10 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar5 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar3 = (int)uVar15;
        iVar6 = iVar3 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar6 = iVar3;
        }
        iVar8 = iVar8 + -1;
        iVar3 = iVar10;
        iVar4 = iVar9;
        iVar5 = iVar1;
      } while (iVar8 != 0);
      (this->S).r[0] = iVar6;
      (this->S).r[1] = iVar10;
      (this->S).r[2] = iVar7;
      (this->S).r[3] = iVar9;
      (this->S).r[4] = iVar1;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar3 = (this->S).r[0];
    if (s < 0x10) {
      iVar9 = s + (s == 0);
      iVar4 = (this->S).r[1];
      iVar5 = (this->S).r[3];
      iVar6 = (this->S).r[4];
      iVar7 = iVar3;
      iVar8 = (this->S).r[2];
      do {
        iVar10 = iVar8;
        iVar1 = iVar7;
        iVar12 = iVar5;
        iVar8 = iVar4;
        uVar14 = (long)iVar12 * (long)(this->P).a[3] + (long)iVar10 * (long)(this->P).a[2] +
                 (long)iVar8 * (long)(this->P).a[1] + (long)iVar1 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar6 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar4 = (int)uVar15;
        iVar7 = iVar4 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar7 = iVar4;
        }
        iVar9 = iVar9 + -1;
        iVar4 = iVar1;
        iVar5 = iVar10;
        iVar6 = iVar12;
      } while (iVar9 != 0);
      (this->S).r[0] = iVar7;
      (this->S).r[1] = iVar1;
      (this->S).r[2] = iVar8;
      (this->S).r[3] = iVar10;
      (this->S).r[4] = iVar12;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar4 = (this->S).r[0];
    if (s < 0x10) {
      iVar10 = s + (s == 0);
      iVar5 = (this->S).r[1];
      iVar6 = (this->S).r[3];
      iVar7 = (this->S).r[4];
      iVar8 = iVar4;
      iVar9 = (this->S).r[2];
      do {
        iVar1 = iVar9;
        iVar12 = iVar8;
        iVar13 = iVar6;
        iVar9 = iVar5;
        uVar14 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar1 * (long)(this->P).a[2] +
                 (long)iVar9 * (long)(this->P).a[1] + (long)iVar12 * (long)(this->P).a[0];
        uVar15 = uVar14 + 0x8000b0e1c2e43c3e;
        if (uVar14 < 0x7fff4f1e3d1bc3c2) {
          uVar15 = uVar14;
        }
        uVar15 = (long)iVar7 * (long)(this->P).a[4] + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        uVar15 = (uVar15 >> 0x1f) * -0x7fffa78f + uVar15;
        iVar5 = (int)uVar15;
        iVar8 = iVar5 + -0x7fffa78f;
        if (uVar15 < 0x7fffa78f) {
          iVar8 = iVar5;
        }
        iVar10 = iVar10 + -1;
        iVar5 = iVar12;
        iVar6 = iVar1;
        iVar7 = iVar13;
      } while (iVar10 != 0);
      (this->S).r[0] = iVar8;
      (this->S).r[1] = iVar12;
      (this->S).r[2] = iVar9;
      (this->S).r[3] = iVar1;
      (this->S).r[4] = iVar13;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar21;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar22);
    }
    iVar5 = (this->S).r[0];
    if (s < 0x10) {
      iVar1 = s + (s == 0);
      iVar6 = (this->S).r[1];
      iVar7 = (this->S).r[2];
      iVar8 = (this->S).r[3];
      iVar9 = (this->S).r[4];
      iVar10 = iVar5;
      do {
        iVar12 = iVar10;
        iVar13 = iVar8;
        iVar8 = iVar7;
        iVar7 = iVar6;
        uVar15 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar8 * (long)(this->P).a[2] +
                 (long)iVar7 * (long)(this->P).a[1] + (long)iVar12 * (long)(this->P).a[0];
        uVar21 = uVar15 + 0x8000b0e1c2e43c3e;
        if (uVar15 < 0x7fff4f1e3d1bc3c2) {
          uVar21 = uVar15;
        }
        uVar21 = (long)iVar9 * (long)(this->P).a[4] + uVar21;
        uVar21 = (uVar21 >> 0x1f) * -0x7fffa78f + uVar21;
        uVar21 = (uVar21 >> 0x1f) * -0x7fffa78f + uVar21;
        iVar6 = (int)uVar21;
        iVar10 = iVar6 + -0x7fffa78f;
        if (uVar21 < 0x7fffa78f) {
          iVar10 = iVar6;
        }
        iVar1 = iVar1 + -1;
        iVar6 = iVar12;
        iVar9 = iVar13;
      } while (iVar1 != 0);
      (this->S).r[0] = iVar10;
      (this->S).r[1] = iVar12;
      (this->S).r[2] = iVar7;
      (this->S).r[3] = iVar8;
      (this->S).r[4] = iVar13;
    }
    else {
      uVar16 = 0;
      do {
        if ((uVar21 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar22 = 1 < uVar21;
        uVar21 = uVar21 >> 1;
      } while (bVar22);
    }
    local_a8 = (this->S).r[0];
    local_b8 = iVar20;
    iStack_b4 = iVar3;
    iStack_b0 = iVar4;
    iStack_ac = iVar5;
    local_98 = iVar19;
    local_94 = iVar18;
    local_90 = iVar17;
    local_8c = iVar11;
    local_88 = iVar2;
    local_84 = iVar20;
    local_80 = iVar19;
    local_7c = iVar18;
    local_78 = iVar17;
    local_74 = iVar11;
    local_70 = iVar3;
    local_6c = iVar20;
    local_68 = iVar19;
    local_64 = iVar18;
    local_60 = iVar17;
    local_5c = iVar4;
    local_58 = iVar3;
    local_54 = iVar20;
    local_50 = iVar19;
    local_4c = iVar18;
    local_48 = iVar5;
    local_44 = iVar4;
    local_40 = iVar3;
    local_3c = iVar20;
    local_38 = iVar19;
    int_math::gauss<5>((int32_t (*) [25])&local_98,(int32_t (*) [5])&local_b8,0x7fffa78f);
    *(ulong *)(this->P).a = CONCAT44(iStack_b4,local_b8);
    *(ulong *)((this->P).a + 2) = CONCAT44(iStack_ac,iStack_b0);
    (this->P).a[4] = local_a8;
    (this->S).r[0] = iVar19;
    (this->S).r[1] = iVar18;
    (this->S).r[2] = iVar17;
    (this->S).r[3] = iVar11;
    (this->S).r[4] = iVar2;
    iVar2 = 5;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::mrg5s::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      jump(s);
      const int32_t q8{S.r[0]};
      jump(s);
      const int32_t q9{S.r[0]};
      int32_t a[5], b[25];
      a[0] = q5;
      b[0] = q4;
      b[1] = q3;
      b[2] = q2;
      b[3] = q1;
      b[4] = q0;
      a[1] = q6;
      b[5] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      b[9] = q1;
      a[2] = q7;
      b[10] = q6;
      b[11] = q5;
      b[12] = q4;
      b[13] = q3;
      b[14] = q2;
      a[3] = q8;
      b[15] = q7;
      b[16] = q6;
      b[17] = q5;
      b[18] = q4;
      b[19] = q3;
      a[4] = q9;
      b[20] = q8;
      b[21] = q7;
      b[22] = q6;
      b[23] = q5;
      b[24] = q4;
      int_math::gauss<5>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      P.a[4] = a[4];
      S.r[0] = q4;
      S.r[1] = q3;
      S.r[2] = q2;
      S.r[3] = q1;
      S.r[4] = q0;
      for (int i{0}; i < 5; ++i)
        backward();
    }
  }